

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O2

Layer * ncnn::Proposal_layer_creator(void)

{
  Proposal *this;
  
  this = (Proposal *)operator_new(0x158);
  Proposal::Proposal(this);
  return &this->super_Layer;
}

Assistant:

Proposal::Proposal()
{
    one_blob_only = false;
    support_inplace = false;

    // TODO load from param
    ratios.create(3);
    ratios[0] = 0.5f;
    ratios[1] = 1.f;
    ratios[2] = 2.f;

    scales.create(3);
    scales[0] = 8.f;
    scales[1] = 16.f;
    scales[2] = 32.f;
}